

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

T_INDEX __thiscall
Nova::Grid<float,_2>::Clamp_To_Cell(Grid<float,_2> *this,TV *X,int number_of_ghost_cells)

{
  int *piVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  undefined4 in_register_00000014;
  TV *value;
  Vector<float,_2,_true> data_copy;
  undefined8 local_28;
  T_STORAGE local_20;
  
  local_28 = *(undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells);
  lVar3 = 0;
  do {
    *(float *)((long)&local_28 + lVar3) =
         *(float *)((long)&local_28 + lVar3) - *(float *)((long)X[1]._data._M_elems + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    *(float *)((long)&local_28 + lVar3) =
         *(float *)((long)&local_28 + lVar3) * *(float *)((long)X[4]._data._M_elems + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    local_20._M_elems[lVar3] = (int)*(float *)((long)&local_28 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    piVar1 = (int *)((long)local_20._M_elems + lVar3);
    *piVar1 = *piVar1 + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  Cell_Indices((Grid<float,_2> *)&stack0xffffffffffffffe8,(int)X);
  *&(this->counts)._data._M_elems = local_20._M_elems;
  lVar3 = 0;
  do {
    iVar2 = (this->counts)._data._M_elems[lVar3];
    iVar4 = *(int *)(&stack0xffffffffffffffe8 + lVar3 * 4);
    if (*(int *)(&stack0xffffffffffffffe8 + lVar3 * 4) < iVar2) {
      iVar4 = iVar2;
    }
    (this->counts)._data._M_elems[lVar3] = iVar4;
    if (*(int *)(&stack0xfffffffffffffff0 + lVar3 * 4) < iVar4) {
      iVar4 = *(int *)(&stack0xfffffffffffffff0 + lVar3 * 4);
    }
    (this->counts)._data._M_elems[lVar3] = iVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return (T_INDEX)(T_STORAGE)this;
}

Assistant:

T_INDEX Clamp_To_Cell(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index=T_INDEX((X-domain.min_corner)*one_over_dX)+1;
        return Cell_Indices(number_of_ghost_cells).Clamp(index);
    }